

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O0

int ssl_parse_encrypted_pms(mbedtls_ssl_context *ssl,uchar *p,uchar *end,size_t pms_offset)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  mbedtls_pk_context *pmVar4;
  size_t ilen;
  uint uStack_d0;
  uint diff;
  size_t peer_pmslen;
  size_t i;
  byte local_b8 [7];
  uchar mask;
  uchar peer_pms [48];
  uchar fake_pms [48];
  byte local_4a;
  byte local_49;
  uchar *puStack_48;
  uchar ver [2];
  uchar *pms;
  size_t len;
  int ret;
  size_t pms_offset_local;
  uchar *end_local;
  uchar *p_local;
  mbedtls_ssl_context *ssl_local;
  
  pmVar4 = mbedtls_ssl_own_key(ssl);
  ilen = mbedtls_pk_get_len(pmVar4);
  puStack_48 = ssl->handshake->premaster + pms_offset;
  pmVar4 = mbedtls_ssl_own_key(ssl);
  iVar2 = mbedtls_pk_can_do(pmVar4,MBEDTLS_PK_RSA);
  if (iVar2 == 0) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0xb9c,"got no RSA private key");
    ssl_local._4_4_ = -0x7600;
  }
  else {
    end_local = p;
    if ((ssl->minor_ver == 0) ||
       (((ulong)*p == (ilen >> 8 & 0xff) && (end_local = p + 2, (ulong)p[1] == (ilen & 0xff))))) {
      if (end_local + ilen == end) {
        mbedtls_ssl_write_version
                  (ssl->handshake->max_major_ver,ssl->handshake->max_minor_ver,
                   *(uint *)&ssl->conf->field_0x164 >> 1 & 1,&local_4a);
        ssl_local._4_4_ = (*ssl->conf->f_rng)(ssl->conf->p_rng,peer_pms + 0x28,0x30);
        if (ssl_local._4_4_ == 0) {
          pmVar4 = mbedtls_ssl_own_key(ssl);
          uVar3 = mbedtls_pk_decrypt(pmVar4,end_local,ilen,local_b8,(size_t *)&uStack_d0,0x30,
                                     ssl->conf->f_rng,ssl->conf->p_rng);
          uVar3 = uVar3 | uStack_d0 ^ 0x30;
          if ((pms_offset < 0x425) && (0x2f < 0x424 - pms_offset)) {
            ssl->handshake->pmslen = 0x30;
            bVar1 = (char)((byte)(uVar3 >> 0x18) |
                          (byte)(-((uint)(local_b8[1] ^ local_49) | local_b8[0] ^ local_4a | uVar3)
                                >> 0x18)) >> 7;
            for (peer_pmslen = 0; peer_pmslen < ssl->handshake->pmslen;
                peer_pmslen = peer_pmslen + 1) {
              puStack_48[peer_pmslen] =
                   bVar1 & peer_pms[peer_pmslen + 0x28] | (bVar1 ^ 0xff) & local_b8[peer_pmslen];
            }
            ssl_local._4_4_ = 0;
          }
          else {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                       ,0xbd7,"should never happen");
            ssl_local._4_4_ = -0x6c00;
          }
        }
      }
      else {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                   ,0xbb2,"bad client key exchange message");
        ssl_local._4_4_ = -0x7c00;
      }
    }
    else {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0xbaa,"bad client key exchange message");
      ssl_local._4_4_ = -0x7c00;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_parse_encrypted_pms( mbedtls_ssl_context *ssl,
                                    const unsigned char *p,
                                    const unsigned char *end,
                                    size_t pms_offset )
{
    int ret;
    size_t len = mbedtls_pk_get_len( mbedtls_ssl_own_key( ssl ) );
    unsigned char *pms = ssl->handshake->premaster + pms_offset;
    unsigned char ver[2];
    unsigned char fake_pms[48], peer_pms[48];
    unsigned char mask;
    size_t i, peer_pmslen;
    unsigned int diff;

    if( ! mbedtls_pk_can_do( mbedtls_ssl_own_key( ssl ), MBEDTLS_PK_RSA ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "got no RSA private key" ) );
        return( MBEDTLS_ERR_SSL_PRIVATE_KEY_REQUIRED );
    }

    /*
     * Decrypt the premaster using own private RSA key
     */
#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_2)
    if( ssl->minor_ver != MBEDTLS_SSL_MINOR_VERSION_0 )
    {
        if( *p++ != ( ( len >> 8 ) & 0xFF ) ||
            *p++ != ( ( len      ) & 0xFF ) )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client key exchange message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE );
        }
    }
#endif

    if( p + len != end )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client key exchange message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE );
    }

    mbedtls_ssl_write_version( ssl->handshake->max_major_ver,
                       ssl->handshake->max_minor_ver,
                       ssl->conf->transport, ver );

    /*
     * Protection against Bleichenbacher's attack: invalid PKCS#1 v1.5 padding
     * must not cause the connection to end immediately; instead, send a
     * bad_record_mac later in the handshake.
     * Also, avoid data-dependant branches here to protect against
     * timing-based variants.
     */
    ret = ssl->conf->f_rng( ssl->conf->p_rng, fake_pms, sizeof( fake_pms ) );
    if( ret != 0 )
        return( ret );

    ret = mbedtls_pk_decrypt( mbedtls_ssl_own_key( ssl ), p, len,
                      peer_pms, &peer_pmslen,
                      sizeof( peer_pms ),
                      ssl->conf->f_rng, ssl->conf->p_rng );

    diff  = (unsigned int) ret;
    diff |= peer_pmslen ^ 48;
    diff |= peer_pms[0] ^ ver[0];
    diff |= peer_pms[1] ^ ver[1];

#if defined(MBEDTLS_SSL_DEBUG_ALL)
    if( diff != 0 )
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client key exchange message" ) );
#endif

    if( sizeof( ssl->handshake->premaster ) < pms_offset ||
        sizeof( ssl->handshake->premaster ) - pms_offset < 48 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }
    ssl->handshake->pmslen = 48;

    /* mask = diff ? 0xff : 0x00 using bit operations to avoid branches */
    /* MSVC has a warning about unary minus on unsigned, but this is
     * well-defined and precisely what we want to do here */
#if defined(_MSC_VER)
#pragma warning( push )
#pragma warning( disable : 4146 )
#endif
    mask = - ( ( diff | - diff ) >> ( sizeof( unsigned int ) * 8 - 1 ) );
#if defined(_MSC_VER)
#pragma warning( pop )
#endif

    for( i = 0; i < ssl->handshake->pmslen; i++ )
        pms[i] = ( mask & fake_pms[i] ) | ( (~mask) & peer_pms[i] );

    return( 0 );
}